

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O3

size_t ans_byte_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  uint64_t uVar10;
  long lVar11;
  long *plVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ans_byte_encode ans_frame;
  long *local_1270;
  void *local_1268;
  ans_byte_encode local_1240;
  
  ans_byte_encode::create(&local_1240,(uint8_t *)src,srcSize);
  local_1270 = (long *)dst;
  local_1268 = dst;
  ans_byte_encode::serialize(&local_1240,(uint8_t **)&local_1270);
  uVar10 = local_1240.lower_bound;
  if ((srcSize & 3) == 0) {
    sVar13 = 0;
  }
  else {
    sVar13 = (size_t)((uint)srcSize & 3);
    lVar11 = 0;
    plVar12 = local_1270;
    do {
      bVar1 = *(byte *)((long)src + lVar11 + (srcSize - 1));
      if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar10) {
        *(int *)plVar12 = (int)uVar10;
        plVar12 = (long *)((long)plVar12 + 4);
        uVar10 = uVar10 >> 0x20;
        local_1270 = plVar12;
      }
      lVar11 = lVar11 + -1;
      uVar3 = local_1240.table._M_elems[bVar1].freq;
      uVar10 = (ulong)local_1240.table._M_elems[bVar1].base + uVar10 % (ulong)uVar3 +
               (uVar10 / uVar3) * local_1240.frame_size;
    } while (-lVar11 != sVar13);
  }
  uVar14 = local_1240.lower_bound;
  uVar15 = local_1240.lower_bound;
  uVar16 = local_1240.lower_bound;
  if (sVar13 != srcSize) {
    uVar17 = srcSize & 0xfffffffffffffffc;
    do {
      bVar1 = *(byte *)((long)src + (uVar17 - 1));
      if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar10) {
        *(int *)local_1270 = (int)uVar10;
        local_1270 = (long *)((long)local_1270 + 4);
        uVar10 = uVar10 >> 0x20;
      }
      uVar3 = local_1240.table._M_elems[bVar1].freq;
      bVar2 = *(byte *)((long)src + (uVar17 - 2));
      uVar4 = local_1240.table._M_elems[bVar1].base;
      if (local_1240.table._M_elems[bVar2].sym_upper_bound <= uVar15) {
        *(int *)local_1270 = (int)uVar15;
        local_1270 = (long *)((long)local_1270 + 4);
        uVar15 = uVar15 >> 0x20;
      }
      uVar5 = local_1240.table._M_elems[bVar2].freq;
      uVar6 = local_1240.table._M_elems[bVar2].base;
      bVar1 = *(byte *)((long)src + (uVar17 - 3));
      if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar14) {
        *(int *)local_1270 = (int)uVar14;
        local_1270 = (long *)((long)local_1270 + 4);
        uVar14 = uVar14 >> 0x20;
      }
      uVar7 = local_1240.table._M_elems[bVar1].freq;
      bVar2 = *(byte *)((long)src + (uVar17 - 4));
      uVar8 = local_1240.table._M_elems[bVar1].base;
      if (local_1240.table._M_elems[bVar2].sym_upper_bound <= uVar16) {
        *(int *)local_1270 = (int)uVar16;
        local_1270 = (long *)((long)local_1270 + 4);
        uVar16 = uVar16 >> 0x20;
      }
      uVar9 = local_1240.table._M_elems[bVar2].freq;
      uVar10 = uVar10 % (ulong)uVar3 + (ulong)uVar4 + (uVar10 / uVar3) * local_1240.frame_size;
      uVar15 = uVar15 % (ulong)uVar5 + (ulong)uVar6 + (uVar15 / uVar5) * local_1240.frame_size;
      uVar14 = uVar14 % (ulong)uVar7 + (ulong)uVar8 + (uVar14 / uVar7) * local_1240.frame_size;
      uVar16 = (ulong)local_1240.table._M_elems[bVar2].base + uVar16 % (ulong)uVar9 +
               (uVar16 / uVar9) * local_1240.frame_size;
      uVar17 = uVar17 - 4;
    } while (uVar17 != 0);
  }
  *local_1270 = uVar10 - local_1240.lower_bound;
  local_1270[1] = uVar15 - local_1240.lower_bound;
  local_1270[2] = uVar14 - local_1240.lower_bound;
  local_1270[3] = uVar16 - local_1240.lower_bound;
  return (long)local_1270 + (0x20 - (long)local_1268);
}

Assistant:

size_t ans_byte_compress(
    void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(src);
    auto ans_frame = ans_byte_encode::create(in_u8, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    uint64_t state_a = ans_frame.initial_state();
    uint64_t state_b = ans_frame.initial_state();
    uint64_t state_c = ans_frame.initial_state();
    uint64_t state_d = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(state_b, in_u8[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(state_c, in_u8[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(state_d, in_u8[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(state_a, out_u8);
    ans_frame.flush_state(state_b, out_u8);
    ans_frame.flush_state(state_c, out_u8);
    ans_frame.flush_state(state_d, out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}